

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *this_00;
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  ostream *poVar4;
  string name;
  ostringstream oss;
  char *local_2c8;
  long local_2c0;
  char local_2b8 [16];
  string local_2a8;
  TestCase local_288;
  SourceLineInfo local_1a0 [2];
  ios_base local_130 [264];
  
  pcVar1 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,pcVar1,
             pcVar1 + (testCase->super_TestCaseInfo).name._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)&local_2c8);
  if (iVar2 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Anonymous test case ",0x14);
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_288,testCase,&local_2a8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_288);
    TestCase::~TestCase(&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  else {
    this_00 = &this->m_functions;
    iVar3 = std::
            _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::find(&this_00->_M_t,testCase);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->m_functions)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar3 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&this_00->_M_t,testCase);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: TEST_CASE( \"",0x13);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2c8,local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ) already defined.\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tFirst seen at ",0xf);
      local_1a0[0].file._M_dataplus._M_p = (pointer)&local_1a0[0].file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a0,iVar3._M_node[6]._M_left,
                 (long)&(iVar3._M_node[6]._M_left)->_M_color +
                 (long)&(iVar3._M_node[6]._M_right)->_M_color);
      local_1a0[0].line = (size_t)iVar3._M_node[7]._M_left;
      poVar4 = operator<<(poVar4,local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tRedefined at ",0xe);
      local_288.super_TestCaseInfo.name._M_dataplus._M_p =
           (pointer)&local_288.super_TestCaseInfo.name.field_2;
      pcVar1 = (testCase->super_TestCaseInfo).lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,pcVar1,
                 pcVar1 + (testCase->super_TestCaseInfo).lineInfo.file._M_string_length);
      local_288.super_TestCaseInfo.className._M_dataplus._M_p =
           (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
      poVar4 = operator<<(poVar4,(SourceLineInfo *)&local_288);
      std::endl<char,std::char_traits<char>>(poVar4);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&local_288);
      SourceLineInfo::~SourceLineInfo(local_1a0);
      exit(1);
    }
    std::
    _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
    ::_M_insert_unique<Catch::TestCase_const&>
              ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                *)this_00,testCase);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functionsInOrder,testCase);
    if ((testCase->super_TestCaseInfo).isHidden == false) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (&this->m_nonHiddenFunctions,testCase);
    }
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getTestCaseInfo().lineInfo ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testCase.getTestCaseInfo().lineInfo ) << std::endl;
                exit(1);
            }
        }